

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void __thiscall
List<Callback::Listener::Signal>::List
          (List<Callback::Listener::Signal> *this,List<Callback::Listener::Signal> *other)

{
  Item *end;
  Item *i;
  List<Callback::Listener::Signal> *other_local;
  List<Callback::Listener::Signal> *this_local;
  
  Iterator::Iterator(&this->_end,&this->endItem);
  Iterator::Iterator(&this->_begin,&this->endItem);
  this->_size = 0;
  Item::Item(&this->endItem);
  this->freeItem = (Item *)0x0;
  this->blocks = (ItemBlock *)0x0;
  (this->endItem).prev = (Item *)0x0;
  (this->endItem).next = (Item *)0x0;
  for (end = (other->_begin).item; end != &other->endItem; end = end->next) {
    append(this,&end->value);
  }
  return;
}

Assistant:

List(const List& other) : _end(&endItem), _begin(&endItem), _size(0), freeItem(0), blocks(0)
  {
    endItem.prev = 0;
    endItem.next = 0;
    for(const Item* i = other._begin.item, * end = &other.endItem; i != end; i = i->next)
      append(i->value);
  }